

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::SetCVRow(ON_NurbsSurface *this,int row_index,ON_3dPoint *point)

{
  bool bVar1;
  int local_2c;
  int i;
  ON_3dPoint *point_local;
  int row_index_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if ((row_index < 0) || (this->m_cv_count[1] < row_index)) {
    this_local._7_1_ = false;
  }
  else {
    for (local_2c = 0; local_2c < this->m_cv_count[0]; local_2c = local_2c + 1) {
      bVar1 = SetCV(this,local_2c,row_index,point);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::SetCVRow(
       int row_index,
       const ON_3dPoint& point
       )
{
  DestroySurfaceTree();
  int i;

  if ( row_index < 0 || row_index > m_cv_count[1] )
    return false;

  for ( i = 0; i < m_cv_count[0]; i++ ) {
    if ( !SetCV( i, row_index, point ) )
      return false;
  }

  return true;
}